

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

size_t sysbvm_dwarf_encodeAlignment(sysbvm_dynarray_t *buffer,size_t alignment)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = buffer->size;
  for (sVar2 = -alignment & (alignment + sVar1) - 1; sVar1 != sVar2; sVar2 = sVar2 - 1) {
    sysbvm_dwarf_encodeByte(buffer,'\0');
  }
  return sVar1;
}

Assistant:

SYSBVM_API size_t sysbvm_dwarf_encodeAlignment(sysbvm_dynarray_t *buffer, size_t alignment)
{
    size_t offset = buffer->size;
    size_t alignedSize = (buffer->size + alignment - 1) & (-alignment);
    size_t padding = alignedSize - buffer->size;
    for(size_t i = 0; i < padding; ++i)
        sysbvm_dwarf_encodeByte(buffer, 0);
    return offset;
}